

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::ImageView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  PlatformInterface *pPVar1;
  long *plVar2;
  undefined8 uVar3;
  deUint32 dVar4;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  size_t sVar7;
  size_t sVar8;
  char *__s;
  size_t sVar9;
  deUint64 *pdVar10;
  long *plVar11;
  int *piVar12;
  size_type __n;
  long lVar13;
  ulong uVar14;
  Environment env;
  AllocationCallbackRecorder allocRecorder;
  undefined1 local_2d8 [16];
  pointer local_2c8;
  VkAllocationCallbacks *pVStack_2c0;
  VkComponentMapping *local_2b0;
  undefined1 local_2a8 [16];
  VkDevice local_298;
  VkAllocationCallbacks *pVStack_290;
  ProgramCollection<vk::ProgramBinary> *local_288;
  VkAllocationCallbacks *local_280;
  deUint32 local_278;
  undefined1 local_270 [40];
  VkAllocationCallbacks *local_248;
  Handle<(vk::HandleType)7> local_240;
  Deleter<vk::Handle<(vk::HandleType)7>_> DStack_238;
  undefined1 local_220 [24];
  VkImage local_208;
  VkAllocationCallbacks *local_200;
  Dependency<vkt::api::(anonymous_namespace)::DeviceMemory> local_1f8;
  Move<vk::Handle<(vk::HandleType)13>_> local_1d0;
  undefined1 local_1b0 [8];
  VkAllocationCallbacks local_1a8;
  VkAllocationCallbacks *local_178;
  size_t sStack_170;
  deUint32 local_168;
  ios_base local_138 [264];
  
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar5 = Context::getDeviceInterface(context);
  pVVar6 = Context::getDevice(context);
  dVar4 = Context::getUniversalQueueFamilyIndex(context);
  local_288 = context->m_progCollection;
  pVStack_290 = (VkAllocationCallbacks *)CONCAT44(pVStack_290._4_4_,dVar4);
  local_278 = 1;
  local_2a8._0_8_ = pPVar1;
  local_2a8._8_8_ = pDVar5;
  local_298 = pVVar6;
  local_280 = &local_1a8;
  ImageView::Resources::Resources((Resources *)local_270,(Environment *)local_2a8,&params);
  sVar7 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  local_220._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_220._8_8_ = (PFN_vkReallocationFunction)0x0;
  local_220._16_4_ = 0;
  local_208.m_internal = local_270._8_8_;
  local_200 = (VkAllocationCallbacks *)params._48_8_;
  local_1f8._0_4_ = params.components.r;
  local_1f8._4_4_ = params.components.g;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._0_4_ =
       params.components.b;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal._4_4_ =
       params.components.a;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)params.subresourceRange._0_8_;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)params.subresourceRange._8_8_;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.
                m_allocator._4_4_,params.subresourceRange.layerCount);
  ::vk::createImageView
            (&local_1d0,(DeviceInterface *)local_2a8._8_8_,local_298,
             (VkImageViewCreateInfo *)local_220,local_280);
  local_2d8._0_8_ =
       local_1d0.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  local_2d8._8_8_ =
       local_1d0.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface;
  local_2c8 = (pointer)local_1d0.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
                       m_device;
  pVStack_2c0 = local_1d0.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  sVar8 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b0);
  if (local_2d8._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_2d8 + 8),
               (VkImageView)local_2d8._0_8_);
  }
  if (local_240.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&DStack_238,(VkDeviceMemory)local_240.m_internal);
  }
  DStack_238.m_device = (VkDevice)0x0;
  DStack_238.m_allocator = (VkAllocationCallbacks *)0x0;
  local_240.m_internal = 0;
  DStack_238.m_deviceIface = (DeviceInterface *)0x0;
  if (local_270._8_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_270 + 0x10),
               (VkImage)local_270._8_8_);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b0);
  sVar7 = getSafeObjectCount((Context *)context->m_testCtx->m_platform,sVar8 - sVar7,0);
  __n = 0x4000;
  if (sVar7 < 0x4000) {
    __n = sVar7;
  }
  local_270._0_8_ = context->m_platformInterface;
  local_270._8_8_ = Context::getDeviceInterface(context);
  local_270._16_8_ = Context::getDevice(context);
  local_270._24_4_ = Context::getUniversalQueueFamilyIndex(context);
  local_270._32_8_ = context->m_progCollection;
  local_248 = (VkAllocationCallbacks *)0x0;
  local_240.m_internal._0_4_ = (int)__n;
  ImageView::Resources::Resources((Resources *)local_220,(Environment *)local_270,&params);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
            *)local_2d8,__n,(allocator_type *)local_1b0);
  local_1b0 = (undefined1  [8])context->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)13>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)((long)local_1a8.pUserData + -0x18) + (int)&local_1a8);
  }
  else {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar7 != 0) {
    local_2b0 = &params.components;
    lVar13 = 8;
    uVar14 = 0;
    do {
      pdVar10 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0xf;
      local_1a8.pUserData = (void *)0x0;
      local_1a8.pfnAllocation._0_4_ = 0;
      local_1a8.pfnReallocation = (PFN_vkReallocationFunction)local_220._8_8_;
      local_1a8.pfnFree = (PFN_vkFreeFunction)params._48_8_;
      local_1a8.pfnInternalAllocation = *(PFN_vkInternalAllocationNotification *)local_2b0;
      local_1a8.pfnInternalFree = *(PFN_vkInternalFreeNotification *)&local_2b0->b;
      local_168 = params.subresourceRange.layerCount;
      local_178 = (VkAllocationCallbacks *)params.subresourceRange._0_8_;
      sStack_170._0_4_ = params.subresourceRange.levelCount;
      sStack_170._4_4_ = params.subresourceRange.baseArrayLayer;
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)local_2a8,
                 (DeviceInterface *)local_270._8_8_,(VkDevice)local_270._16_8_,
                 (VkImageViewCreateInfo *)local_1b0,local_248);
      pdVar10[2] = (deUint64)local_298;
      pdVar10[3] = (deUint64)pVStack_290;
      *pdVar10 = local_2a8._0_8_;
      pdVar10[1] = local_2a8._8_8_;
      local_2a8._0_8_ = (PlatformInterface *)0x0;
      local_2a8._8_8_ = (DeviceInterface *)0x0;
      local_298 = (VkDevice)0x0;
      pVStack_290 = (VkAllocationCallbacks *)0x0;
      plVar11 = (long *)operator_new(0x20);
      uVar3 = local_2d8._0_8_;
      *(undefined4 *)(plVar11 + 1) = 0;
      *(undefined4 *)((long)plVar11 + 0xc) = 0;
      *plVar11 = (long)&PTR__SharedPtrState_00d24850;
      plVar11[2] = (long)pdVar10;
      *(undefined4 *)(plVar11 + 1) = 1;
      *(undefined4 *)((long)plVar11 + 0xc) = 1;
      plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)local_2d8._0_8_ + lVar13
                         );
      if (plVar2 != plVar11) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)(local_2d8._0_8_ + lVar13 + -8) = 0;
            (**(code **)(**(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)
                                           local_2d8._0_8_ + lVar13) + 0x10))();
          }
          LOCK();
          piVar12 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar3 +
                                     lVar13) + 0xc);
          *piVar12 = *piVar12 + -1;
          UNLOCK();
          if (*piVar12 == 0) {
            plVar2 = *(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar3 + lVar13);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar3 + lVar13) = 0;
          }
        }
        *(deUint64 **)(uVar3 + lVar13 + -8) = pdVar10;
        *(long **)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar3 + lVar13) = plVar11;
        LOCK();
        *(int *)(plVar11 + 1) = (int)plVar11[1] + 1;
        UNLOCK();
        LOCK();
        piVar12 = (int *)(*(long *)((long)(Unique<vk::Handle<(vk::HandleType)13>_> **)uVar3 + lVar13
                                   ) + 0xc);
        *piVar12 = *piVar12 + 1;
        UNLOCK();
      }
      plVar2 = plVar11 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar11 + 0x10))(plVar11);
      }
      piVar12 = (int *)((long)plVar11 + 0xc);
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        (**(code **)(*plVar11 + 8))(plVar11);
      }
      if (local_2a8._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_2a8 + 8),
                   (VkImageView)local_2a8._0_8_);
      }
      if ((uVar14 & 0x3ff) == 0 && uVar14 != 0) {
        tcu::TestContext::touchWatchdog(context->m_testCtx);
      }
      uVar14 = uVar14 + 1;
      lVar13 = lVar13 + 0x10;
    } while (__n != uVar14);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                     *)local_2d8,(pointer)local_2d8._0_8_);
  local_1b0 = (undefined1  [8])&local_1a8.pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b0,
             (undefined1 *)((long)local_1a8.pUserData + (long)local_1b0));
  if (local_1b0 != (undefined1  [8])&local_1a8.pfnAllocation) {
    operator_delete((void *)local_1b0,
                    CONCAT44(local_1a8.pfnAllocation._4_4_,
                             (VkImageViewCreateFlags)local_1a8.pfnAllocation) + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
             *)local_2d8);
  if (local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0)
  {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
              (&local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
               (VkDeviceMemory)
               local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
               m_internal);
  }
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  local_1f8.object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_220._8_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_220 + 0x10),
               (VkImage)local_220._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}